

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

bool duckdb_yyjson::yyjson_alc_pool_init(yyjson_alc *alc,void *buf,usize size)

{
  ulong *puVar1;
  ulong uVar2;
  
  if (alc != (yyjson_alc *)0x0) {
    alc->free = (_func_void_void_ptr_void_ptr *)0x1d1ec95;
    alc->ctx = (void *)0;
    alc->malloc = (_func_void_ptr_void_ptr_size_t *)0x1d1ec8f;
    alc->realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x1d1ec92;
    if ((0x3f < size) &&
       (puVar1 = (ulong *)((long)buf + 0xfU & 0xfffffffffffffff0), puVar1 != (ulong *)0x0)) {
      uVar2 = (long)buf + (size - (long)puVar1) & 0xfffffffffffffff0;
      puVar1[2] = uVar2 - 0x10;
      puVar1[3] = 0;
      *puVar1 = uVar2;
      puVar1[1] = (ulong)(puVar1 + 2);
      alc->malloc = pool_malloc;
      alc->realloc = pool_realloc;
      alc->free = pool_free;
      alc->ctx = puVar1;
      return true;
    }
  }
  return false;
}

Assistant:

bool yyjson_alc_pool_init(yyjson_alc *alc, void *buf, usize size) {
    pool_chunk *chunk;
    pool_ctx *ctx;

    if (unlikely(!alc)) return false;
    *alc = YYJSON_NULL_ALC;
    if (size < sizeof(pool_ctx) * 4) return false;
    ctx = (pool_ctx *)mem_align_up(buf, sizeof(pool_ctx));
    if (unlikely(!ctx)) return false;
    size -= (usize)((u8 *)ctx - (u8 *)buf);
    size = size_align_down(size, sizeof(pool_ctx));

    chunk = (pool_chunk *)(ctx + 1);
    chunk->size = size - sizeof(pool_ctx);
    chunk->next = NULL;
    ctx->size = size;
    ctx->free_list = chunk;

    alc->malloc = pool_malloc;
    alc->realloc = pool_realloc;
    alc->free = pool_free;
    alc->ctx = (void *)ctx;
    return true;
}